

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void bswap_args(PDISASM pMyDisasm,int index)

{
  int index_local;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else {
    (pMyDisasm->Instruction).Category = 0x10001;
    strcpy((pMyDisasm->Instruction).Mnemonic,"bswap");
    if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
      (pMyDisasm->Operand1).OpSize = 0x40;
      if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
        strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[index + 8]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 1;
        (pMyDisasm->Operand1).Registers.gpr = REGS[index + 8];
      }
      else {
        strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[index]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 1;
        (pMyDisasm->Operand1).Registers.gpr = REGS[index];
      }
    }
    else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      (pMyDisasm->Operand1).OpSize = 0x20;
      if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
        strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[index + 8]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 1;
        (pMyDisasm->Operand1).Registers.gpr = REGS[index + 8];
      }
      else {
        strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[index]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 1;
        (pMyDisasm->Operand1).Registers.gpr = REGS[index];
      }
    }
    else {
      (pMyDisasm->Operand1).OpSize = 0x10;
      if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
        strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[index + 8]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 1;
        (pMyDisasm->Operand1).Registers.gpr = REGS[index + 8];
      }
      else {
        strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[index]);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 1;
        (pMyDisasm->Operand1).Registers.gpr = REGS[index];
      }
    }
    (pMyDisasm->Operand1).AccessMode = 3;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    FillFlags(pMyDisasm,10);
  }
  return;
}

Assistant:

void __bea_callspec__ bswap_args(PDISASM pMyDisasm, int index)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "bswap");
  #endif
  if (GV.OperandSize == 64) {
    pMyDisasm->Operand1.OpSize = 64;
    if (GV.REX.B_ == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[index+8]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+8];
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[index+0]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+0];
    }
  }
  else if (GV.OperandSize == 32){
    pMyDisasm->Operand1.OpSize = 32;
    if (GV.REX.B_ == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[index+8]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+8];
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[index+0]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+0];
    }
  }
  else {
    pMyDisasm->Operand1.OpSize = 16;
    if (GV.REX.B_ == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[index+8]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+8];
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[index+0]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+0];
    }
  }
  pMyDisasm->Operand1.AccessMode = READ + WRITE;
  GV.EIP_++;
  FillFlags(pMyDisasm,10);
}